

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t
add_to_list(exr_context_t ctxt,exr_attribute_list_t *list,exr_attribute_t *nattr,char *name)

{
  undefined8 *puVar1;
  int iVar2;
  exr_result_t eVar3;
  int iVar4;
  exr_attribute_list_t *list_00;
  undefined8 *in_RDX;
  int *in_RSI;
  long in_RDI;
  exr_attribute_t *prev;
  int i;
  size_t nsize;
  exr_result_t rv;
  exr_attribute_t **sorted_attrs;
  exr_attribute_t **attrs;
  int insertpos;
  int nattrsz;
  int cattrsz;
  exr_attribute_t *in_stack_000001e0;
  exr_context_t in_stack_000001e8;
  int local_5c;
  ulong local_58;
  exr_attribute_t *attr;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  
  iVar5 = *in_RSI;
  iVar2 = iVar5 + 1;
  list_00 = *(exr_attribute_list_t **)(in_RSI + 2);
  attr = *(exr_attribute_t **)(in_RSI + 4);
  if (in_RSI[1] < iVar2) {
    local_58 = (long)in_RSI[1] << 1;
    if (local_58 < (ulong)(long)iVar2) {
      local_58 = (long)iVar2 + 1;
    }
    list_00 = (exr_attribute_list_t *)(**(code **)(in_RDI + 0x58))(local_58 << 4);
    if (list_00 == (exr_attribute_list_t *)0x0) {
      (**(code **)(in_RDI + 0x60))(in_RDX);
      eVar3 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
      return eVar3;
    }
    in_RSI[1] = (int)local_58;
    attr = (exr_attribute_t *)(&list_00->num_attributes + local_58 * 2);
    for (local_5c = 0; local_5c < iVar5; local_5c = local_5c + 1) {
      *(undefined8 *)(&list_00->num_attributes + (long)local_5c * 2) =
           *(undefined8 *)(*(long *)(in_RSI + 2) + (long)local_5c * 8);
      *(undefined8 *)(attr->pad + (long)local_5c * 8 + -0x12) =
           *(undefined8 *)(*(long *)(in_RSI + 4) + (long)local_5c * 8);
    }
    if (*(long *)(in_RSI + 2) != 0) {
      (**(code **)(in_RDI + 0x60))(*(undefined8 *)(in_RSI + 2));
    }
    *(exr_attribute_list_t **)(in_RSI + 2) = list_00;
    *(exr_attribute_t **)(in_RSI + 4) = attr;
  }
  *(undefined8 **)(&list_00->num_attributes + (long)iVar5 * 2) = in_RDX;
  *(undefined8 **)(attr->pad + (long)iVar5 * 8 + -0x12) = in_RDX;
  while (iVar5 = iVar5 + -1, -1 < iVar5) {
    puVar1 = *(undefined8 **)(attr->pad + (long)iVar5 * 8 + -0x12);
    iVar4 = strcmp((char *)*in_RDX,(char *)*puVar1);
    if (-1 < iVar4) break;
    *(undefined8 **)(attr->pad + (long)(iVar5 + 1) * 8 + -0x12) = puVar1;
    *(undefined8 **)(attr->pad + (long)iVar5 * 8 + -0x12) = in_RDX;
  }
  *in_RSI = iVar2;
  eVar3 = attr_init(in_stack_000001e8,in_stack_000001e0);
  if (eVar3 != 0) {
    exr_attr_list_remove((exr_context_t)CONCAT44(iVar5,in_stack_ffffffffffffffc8),list_00,attr);
  }
  return eVar3;
}

Assistant:

static exr_result_t
add_to_list (
    exr_context_t         ctxt,
    exr_attribute_list_t* list,
    exr_attribute_t*      nattr,
    const char*           name)
{
    int               cattrsz = list->num_attributes;
    int               nattrsz = cattrsz + 1;
    int               insertpos;
    exr_attribute_t** attrs        = list->entries;
    exr_attribute_t** sorted_attrs = list->sorted_entries;
    exr_result_t      rv           = EXR_ERR_SUCCESS;

    (void) name;
    if (nattrsz > list->num_alloced)
    {
        size_t nsize = (size_t) (list->num_alloced) * 2;
        if ((size_t) nattrsz > nsize) nsize = (size_t) (nattrsz) + 1;
        attrs = (exr_attribute_t**) ctxt->alloc_fn (
            sizeof (exr_attribute_t*) * nsize * 2);
        if (!attrs)
        {
            ctxt->free_fn (nattr);
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }

        list->num_alloced = (int32_t) nsize;
        sorted_attrs      = attrs + nsize;

        for (int i = 0; i < cattrsz; ++i)
        {
            attrs[i]        = list->entries[i];
            sorted_attrs[i] = list->sorted_entries[i];
        }

        if (list->entries) ctxt->free_fn (list->entries);
        list->entries        = attrs;
        list->sorted_entries = sorted_attrs;
    }
    attrs[cattrsz]        = nattr;
    sorted_attrs[cattrsz] = nattr;
    insertpos             = cattrsz - 1;

    // FYI: qsort is shockingly slow, just do a quick search and
    // bubble it up until it's in the correct location
    while (insertpos >= 0)
    {
        exr_attribute_t* prev = sorted_attrs[insertpos];

        if (strcmp (nattr->name, prev->name) >= 0) break;

        sorted_attrs[insertpos + 1] = prev;
        sorted_attrs[insertpos]     = nattr;
        --insertpos;
    }

    list->num_attributes = nattrsz;
    rv                   = attr_init (ctxt, nattr);
    if (rv != EXR_ERR_SUCCESS) exr_attr_list_remove (ctxt, list, nattr);
    return rv;
}